

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O3

int Abc_NtkLatchIsSelfFeed_rec(Abc_Obj_t *pLatch,Abc_Obj_t *pLatchRoot)

{
  long *plVar1;
  Abc_Obj_t *pAVar2;
  uint uVar3;
  
  uVar3 = *(uint *)&pLatch->field_0x14;
  do {
    if ((uVar3 & 0xf) != 8) {
      __assert_fail("Abc_ObjIsLatch(pLatch)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                    ,0x33,"int Abc_NtkLatchIsSelfFeed_rec(Abc_Obj_t *, Abc_Obj_t *)");
    }
    if (pLatch == pLatchRoot) {
      return 1;
    }
    plVar1 = (long *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanins).pArray];
    plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
    if ((*(uint *)((long)plVar1 + 0x14) & 0xf) != 5) {
      return 0;
    }
    pAVar2 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8)
    ;
    uVar3 = *(uint *)&pAVar2->field_0x14;
    pLatchRoot = pLatch;
    pLatch = pAVar2;
  } while ((uVar3 & 0xf) == 8);
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks if latches form self-loop.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Abc_NtkLatchIsSelfFeed_rec( Abc_Obj_t * pLatch, Abc_Obj_t * pLatchRoot )
{
    Abc_Obj_t * pFanin;
    assert( Abc_ObjIsLatch(pLatch) );
    if ( pLatch == pLatchRoot )
        return 1;
    pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
    if ( !Abc_ObjIsBo(pFanin) || !Abc_ObjIsLatch(Abc_ObjFanin0(pFanin)) )
        return 0;
    return Abc_NtkLatchIsSelfFeed_rec( Abc_ObjFanin0(pFanin), pLatch );
}